

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

Abbrev * __thiscall bloaty::dwarf::DIEReader::ReadCode(DIEReader *this,CU *cu)

{
  bool bVar1;
  uint code_00;
  AbbrevTable *in_RSI;
  DIEReader *in_RDI;
  Abbrev *ret;
  uint32_t code;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  Abbrev *local_8;
  
  SkipNullEntries(in_RDI);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->remaining_);
  if (bVar1) {
    local_8 = (Abbrev *)0x0;
  }
  else {
    code_00 = ReadLEB128<unsigned_int>
                        ((string_view *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    bVar1 = AbbrevTable::GetAbbrev
                      (in_RSI,code_00,
                       (Abbrev **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (!bVar1) {
      Throw((char *)CONCAT44(code_00,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
    if ((*(byte *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 6) & 1) != 0) {
      in_RDI->depth_ = in_RDI->depth_ + 1;
    }
    local_8 = (Abbrev *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

const AbbrevTable::Abbrev* DIEReader::ReadCode(const CU& cu) {
  SkipNullEntries();
  if (remaining_.empty()) {
    return nullptr;
  }
  uint32_t code = ReadLEB128<uint32_t>(&remaining_);
  const AbbrevTable::Abbrev* ret;
  if (!cu.unit_abbrev_->GetAbbrev(code, &ret)) {
    THROW("couldn't find abbreviation for code");
  }
  if (ret->has_child) {
    depth_++;
  }
  return ret;
}